

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_error.cc
# Opt level: O0

void SM_PrintError(RC rc)

{
  ostream *poVar1;
  int *piVar2;
  char *pcVar3;
  RC rc_local;
  
  if ((rc < 0x12d) || (0x135 < rc)) {
    if ((-rc < 0x12d) || (0x12d < -rc)) {
      if (rc == -0xb) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        poVar1 = std::operator<<((ostream *)&std::cerr,pcVar3);
        std::operator<<(poVar1,"\n");
      }
      else if (rc == 0) {
        std::operator<<((ostream *)&std::cerr,"SM_PrintError called with return code of 0\n");
      }
      else {
        poVar1 = std::operator<<((ostream *)&std::cerr,"SM error: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,rc);
        std::operator<<(poVar1," is out of bounds\n");
      }
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cerr,"SM error: ");
      poVar1 = std::operator<<(poVar1,SM_ErrorMsg[-0x12d - rc]);
      std::operator<<(poVar1,"\n");
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"SM warning: ");
    poVar1 = std::operator<<(poVar1,SM_WarnMsg[rc + -0x12d]);
    std::operator<<(poVar1,"\n");
  }
  return;
}

Assistant:

void SM_PrintError(RC rc)
{
  // Check the return code is within proper limits
  if (rc >= START_SM_WARN && rc <= SM_LASTWARN)
    // Print warning
    cerr << "SM warning: " << SM_WarnMsg[rc - START_SM_WARN] << "\n";
  // Error codes are negative, so invert everything
  else if (-rc >= -START_SM_ERR && -rc < -SM_LASTERROR)
    // Print error
    cerr << "SM error: " << SM_ErrorMsg[-rc + START_SM_ERR] << "\n";
  else if (rc == PF_UNIX)
#ifdef PC
      cerr << "OS error\n";
#else
      cerr << strerror(errno) << "\n";
#endif
  else if (rc == 0)
    cerr << "SM_PrintError called with return code of 0\n";
  else
    cerr << "SM error: " << rc << " is out of bounds\n";
}